

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_algebra.h
# Opt level: O1

quaternion * dja::operator*=(quaternion *a,float_t *b)

{
  float fVar1;
  float fVar2;
  float fVar3;
  
  fVar1 = *b;
  fVar2 = (a->im).y;
  fVar3 = (a->im).z;
  a->re = a->re * fVar1;
  (a->im).x = (a->im).x * fVar1;
  (a->im).y = fVar2 * fVar1;
  (a->im).z = fVar1 * fVar3;
  return a;
}

Assistant:

Q normalize(const Q& q) {return Q(normalize(V4(q)));}